

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_forward_Test::TestBody
          (IntrusiveListIteratorTest_cbegin_cend_forward_Test *this)

{
  TestObjectList *this_00;
  TestObject *pTVar1;
  IntrusiveListIteratorTest *this_01;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  vector<int,_std::allocator<int>_> *in_R9;
  const_iterator first;
  const_iterator first_00;
  undefined8 local_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = &(this->super_IntrusiveListIteratorTest).list_;
  pTVar1 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_54 = 0x200000001;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_4c = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_48,&local_54);
  first.node_ = (TestObject *)this_00;
  first.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)pTVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (vector<int,std::allocator<int>> *)&local_48;
  anon_unknown.dwarf_599a8::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            ((IntrusiveListIteratorTest *)this_00,first,(const_iterator)(auVar3 << 0x40),in_R9);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  this_01 = (IntrusiveListIteratorTest *)(this->super_IntrusiveListIteratorTest).clist_;
  piVar2 = (intrusive_list<(anonymous_namespace)::TestObject> *)
           (this_01->super_IntrusiveListTest).super_Test._vptr_Test;
  local_54 = 0x200000001;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_4c = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_48,&local_54,&local_48);
  first_00.node_ = (TestObject *)this_01;
  first_00.list_ = piVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (vector<int,std::allocator<int>> *)&local_48;
  anon_unknown.dwarf_599a8::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (this_01,first_00,(const_iterator)(auVar4 << 0x40),in_R9);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_forward) {
  TestForward(list_.cbegin(), list_.cend(), {1, 2, 3});
  TestForward(clist_.cbegin(), clist_.cend(), {1, 2, 3});
}